

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O0

cupdlp_int PDHG_Clear(CUPDLPwork *w)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  void *in_RDI;
  CUPDLPtimers *timers_00;
  cupdlp_float begin;
  CUPDLPscaling *scaling;
  CUPDLPtimers *timers;
  CUPDLPstepsize *stepsize;
  CUPDLPresobj *resobj;
  CUPDLPiterates *iterates;
  CUPDLPsettings *settings;
  CUPDLPproblem *problem;
  int log_level;
  
  lVar1 = *(long *)((long)in_RDI + 8);
  lVar2 = *(long *)((long)in_RDI + 0x18);
  lVar3 = *(long *)((long)in_RDI + 0x10);
  lVar4 = *(long *)((long)in_RDI + 0x20);
  lVar5 = *(long *)((long)in_RDI + 0x30);
  log_level = (int)((ulong)*(undefined8 *)((long)in_RDI + 0x28) >> 0x20);
  timers_00 = (CUPDLPtimers *)getTimeStamp();
  if (*(long *)((long)in_RDI + 0x58) != 0) {
    free(*(void **)((long)in_RDI + 0x58));
    *(undefined8 *)((long)in_RDI + 0x58) = 0;
  }
  if (*(long *)((long)in_RDI + 0x50) != 0) {
    free(*(void **)((long)in_RDI + 0x50));
    *(undefined8 *)((long)in_RDI + 0x50) = 0;
  }
  if (*(long *)((long)in_RDI + 0x38) != 0) {
    vec_clear((CUPDLPvec *)0x8034bc);
  }
  if (*(long *)((long)in_RDI + 0x40) != 0) {
    free(*(void **)((long)in_RDI + 0x40));
  }
  if (*(long *)((long)in_RDI + 0x48) != 0) {
    free(*(void **)((long)in_RDI + 0x48));
  }
  if (lVar2 != 0) {
    iterates_clear((CUPDLPiterates *)0x803513);
  }
  if (lVar3 != 0) {
    resobj_clear((CUPDLPresobj *)0x803525);
  }
  if (lVar1 != 0) {
    settings_clear((CUPDLPsettings *)0x803537);
  }
  if (lVar4 != 0) {
    stepsize_clear((CUPDLPstepsize *)0x803549);
  }
  if (lVar5 != 0) {
    timers_clear(log_level,timers_00);
  }
  free(in_RDI);
  return 0;
}

Assistant:

cupdlp_int PDHG_Clear(CUPDLPwork *w) {
  CUPDLPproblem *problem = w->problem;
  CUPDLPsettings *settings = w->settings;
  CUPDLPiterates *iterates = w->iterates;
  CUPDLPresobj *resobj = w->resobj;
  CUPDLPstepsize *stepsize = w->stepsize;
  CUPDLPtimers *timers = w->timers;
  CUPDLPscaling *scaling = w->scaling;


  cupdlp_float begin = getTimeStamp();
#ifndef CUPDLP_CPU

  // CUDAmv *MV = w->MV;
  // if (MV)
  // {
  //     cupdlp_float begin = getTimeStamp();
  //     cuda_free_mv(MV);
  //     timers->FreeDeviceMemTime += getTimeStamp() - begin;
  // }
  CHECK_CUBLAS(cublasDestroy(w->cublashandle))
  CHECK_CUSPARSE(cusparseDestroy(w->cusparsehandle))
  CHECK_CUDA(cudaFree(w->dBuffer_csc_ATy))
  CHECK_CUDA(cudaFree(w->dBuffer_csr_Ax))
  if (w->buffer2) CUPDLP_FREE_VEC(w->buffer2);
  if (w->buffer3) CUPDLP_FREE_VEC(w->buffer3);
#endif
  if (w->colScale) CUPDLP_FREE_VEC(w->colScale);
  if (w->rowScale) CUPDLP_FREE_VEC(w->rowScale);

  if (w->buffer) {
    // CUPDLP_FREE_VEC(w->buffer);
    vec_clear(w->buffer);
  }

  if (w->buffer2 != NULL) {
    // CUPDLP_FREE_VEC(w->buffer);
    free(w->buffer2);
  }

  if (w->buffer3) {
    // CUPDLP_FREE_VEC(w->buffer);
    free(w->buffer3);
  }

  if (problem) {
    // problem_clear(problem);
    problem = cupdlp_NULL;
  }

  if (iterates) {
    iterates_clear(iterates);
  }

  if (resobj) {
    resobj_clear(resobj);
  }

#ifndef CUPDLP_CPU
  timers->FreeDeviceMemTime += getTimeStamp() - begin;
#endif

  if (settings) {
    settings_clear(settings);
  }
  if (stepsize) {
    stepsize_clear(stepsize);
  }
  if (timers) {
  timers_clear(w->settings->nLogLevel, timers);
  }
  if (scaling) {
    // scaling_clear(scaling);
    // if (scaling->colScale) {
    //    cupdlp_free(scaling->colScale);
    // }
    // if (scaling->rowScale) {
    //    cupdlp_free(scaling->rowScale);
    // }
    // cupdlp_free(scaling);
    scaling = cupdlp_NULL;
  }
  cupdlp_free(w);

  return 0;
}